

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::int128::ToString_abi_cxx11_(string *__return_storage_ptr__,int128 *this)

{
  fmtflags in_R8D;
  uint128 uVar1;
  uint128 v;
  int128 in_stack_ffffffffffffffc8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)((long)&this->v_ + 8) < 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  uVar1 = anon_unknown_2::UnsignedAbsoluteValue
                    (*(anon_unknown_2 **)&this->v_,in_stack_ffffffffffffffc8);
  v.lo_ = uVar1.hi_;
  v.hi_ = 2;
  lts_20250127::(anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
            ((string *)&stack0xffffffffffffffd0,(void *)uVar1.lo_,v,in_R8D);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

std::string int128::ToString() const {
  std::string rep;
  if (Int128High64(*this) < 0) rep = "-";
  rep.append(Uint128ToFormattedString(UnsignedAbsoluteValue(*this),
                                      std::ios_base::dec));
  return rep;
}